

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

UniValue *
blockToJSON(BlockManager *blockman,CBlock *block,CBlockIndex *tip,CBlockIndex *blockindex,
           TxVerbosity verbosity)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  BlockManager *this;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  UniValue *txundo_00;
  element_type *tx_00;
  UniValue *in_RDI;
  TxVerbosity in_R9D;
  long in_FS_OFFSET;
  bool bVar6;
  CTxUndo *txundo;
  CTransactionRef *tx_1;
  size_t i;
  bool have_undo;
  bool is_not_pruned;
  CTransactionRef *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range2;
  UniValue *result;
  CBlockUndo blockUndo;
  const_iterator __end2;
  const_iterator __begin2;
  UniValue objTx;
  UniValue txs;
  CTransaction *in_stack_fffffffffffffa38;
  CBlock *in_stack_fffffffffffffa40;
  CBlock *in_stack_fffffffffffffa48;
  UniValue *in_stack_fffffffffffffa50;
  UniValue *in_stack_fffffffffffffa58;
  UniValue *in_stack_fffffffffffffa70;
  UniValue *in_stack_fffffffffffffa78;
  UniValue *in_stack_fffffffffffffa80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffab8;
  TxVerbosity TVar7;
  CBlockUndo *blockundo;
  CBlockIndex *in_stack_fffffffffffffaf0;
  CBlockIndex *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  allocator<char> local_462 [50];
  shared_ptr<const_CTransaction> *local_430;
  shared_ptr<const_CTransaction> *local_428;
  undefined4 local_420;
  allocator<char> local_419;
  ParamsWrapper<TransactionSerParams,_const_CBlock> local_418;
  undefined4 local_408;
  allocator<char> local_401;
  ParamsWrapper<TransactionSerParams,_const_CBlock> local_400;
  undefined4 local_3f0;
  allocator<char> local_3e9;
  UniValue local_3e8;
  UniValue local_370;
  uint256 local_318 [2];
  UniValue local_2d8 [2];
  CBlockUndo local_1e8 [20];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  blockheaderToJSON(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (allocator<char> *)in_stack_fffffffffffffa78);
  local_400 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa40
                        );
  sVar3 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)in_stack_fffffffffffffa40)
  ;
  local_3f0 = (undefined4)sVar3;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffffa78,(int *)in_stack_fffffffffffffa70);
  UniValue::pushKV(in_stack_fffffffffffffa80,(string *)in_stack_fffffffffffffa78,
                   in_stack_fffffffffffffa70);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  std::allocator<char>::~allocator(&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (allocator<char> *)in_stack_fffffffffffffa78);
  local_418 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffffa48,in_stack_fffffffffffffa40
                        );
  sVar3 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)in_stack_fffffffffffffa40)
  ;
  local_408 = (undefined4)sVar3;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffffa78,(int *)in_stack_fffffffffffffa70);
  UniValue::pushKV(in_stack_fffffffffffffa80,(string *)in_stack_fffffffffffffa78,
                   in_stack_fffffffffffffa70);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (allocator<char> *)in_stack_fffffffffffffa78);
  this = (BlockManager *)GetBlockWeight(in_stack_fffffffffffffa48);
  local_420 = SUB84(this,0);
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffffa78,(int *)in_stack_fffffffffffffa70);
  UniValue::pushKV(in_stack_fffffffffffffa80,(string *)in_stack_fffffffffffffa78,
                   in_stack_fffffffffffffa70);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  std::allocator<char>::~allocator(&local_419);
  blockundo = local_1e8;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa50);
  UniValue::UniValue(in_stack_fffffffffffffa58,(VType)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                     (string *)in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  if (in_R9D == SHOW_TXID) {
    local_428 = (shared_ptr<const_CTransaction> *)
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)in_stack_fffffffffffffa40);
    local_430 = (shared_ptr<const_CTransaction> *)
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)in_stack_fffffffffffffa40);
    while( true ) {
      bVar6 = __gnu_cxx::
              operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                          *)in_stack_fffffffffffffa48,
                         (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                          *)in_stack_fffffffffffffa40);
      if (((bVar6 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                   *)in_stack_fffffffffffffa38);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffa38);
      CTransaction::GetHash(in_stack_fffffffffffffa38);
      transaction_identifier<false>::GetHex_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffffa40);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      UniValue::push_back(in_stack_fffffffffffffa50,(UniValue *)in_stack_fffffffffffffa48);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa38);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
      ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                    *)in_stack_fffffffffffffa38);
    }
  }
  else if (in_R9D - SHOW_DETAILS < 2) {
    TVar7 = in_R9D;
    CBlockUndo::CBlockUndo((CBlockUndo *)in_stack_fffffffffffffa38);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa38);
    bVar1 = blockToJSON::anon_class_16_2_71e2ef31::operator()
                      ((anon_class_16_2_71e2ef31 *)in_stack_fffffffffffffa58);
    bVar6 = false;
    if (bVar1) {
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa38);
      uVar2 = blockToJSON::anon_class_8_1_eab17e23::operator()
                        ((anon_class_8_1_eab17e23 *)in_stack_fffffffffffffa48);
      bVar6 = uVar2 != 0;
    }
    if (bVar6) {
      bVar1 = node::BlockManager::UndoReadFromDisk
                        (this,blockundo,(CBlockIndex *)CONCAT44(TVar7,in_stack_fffffffffffffab8));
      if (!bVar1) {
        uVar4 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
                   (allocator<char> *)in_stack_fffffffffffffa78);
        JSONRPCError((int)((ulong)in_stack_fffffffffffffa88 >> 0x20),
                     (string *)in_stack_fffffffffffffa78);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_0053e231;
      }
    }
    local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while( true ) {
      in_stack_fffffffffffffa88 = local_4c8;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)in_stack_fffffffffffffa38);
      if (pbVar5 <= in_stack_fffffffffffffa88) break;
      in_stack_fffffffffffffa80 =
           (UniValue *)
           std::
           vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffa48,(size_type)in_stack_fffffffffffffa40);
      if ((bVar6) &&
         (local_4c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        txundo_00 = (UniValue *)
                    std::vector<CTxUndo,_std::allocator<CTxUndo>_>::at
                              ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)
                               in_stack_fffffffffffffa48,(size_type)in_stack_fffffffffffffa40);
        in_stack_fffffffffffffa78 = txundo_00;
      }
      else {
        txundo_00 = (UniValue *)0x0;
      }
      in_stack_fffffffffffffa70 = txundo_00;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa50);
      UniValue::UniValue(in_stack_fffffffffffffa58,(VType)((ulong)in_stack_fffffffffffffa50 >> 0x20)
                         ,(string *)in_stack_fffffffffffffa48);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa38);
      tx_00 = std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffa48);
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_318[0].super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      uint256::uint256((uint256 *)in_stack_fffffffffffffa38);
      TxToUniv(tx_00,local_318,local_2d8,true,(CTxUndo *)txundo_00,in_R9D);
      in_stack_fffffffffffffa58 = &local_370;
      UniValue::UniValue((UniValue *)in_stack_fffffffffffffa48,(UniValue *)in_stack_fffffffffffffa40
                        );
      UniValue::push_back(in_stack_fffffffffffffa50,(UniValue *)in_stack_fffffffffffffa48);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
      local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(local_4c8->_M_dataplus)._M_p + 1);
    }
    CBlockUndo::~CBlockUndo((CBlockUndo *)in_stack_fffffffffffffa38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa88,(char *)in_stack_fffffffffffffa80,
             (allocator<char> *)in_stack_fffffffffffffa78);
  UniValue::UniValue(&local_3e8,(UniValue *)in_stack_fffffffffffffa40);
  UniValue::pushKV(in_stack_fffffffffffffa80,(string *)in_stack_fffffffffffffa78,
                   in_stack_fffffffffffffa70);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  std::allocator<char>::~allocator(local_462);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffffa38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
LAB_0053e231:
  __stack_chk_fail();
}

Assistant:

UniValue blockToJSON(BlockManager& blockman, const CBlock& block, const CBlockIndex& tip, const CBlockIndex& blockindex, TxVerbosity verbosity)
{
    UniValue result = blockheaderToJSON(tip, blockindex);

    result.pushKV("strippedsize", (int)::GetSerializeSize(TX_NO_WITNESS(block)));
    result.pushKV("size", (int)::GetSerializeSize(TX_WITH_WITNESS(block)));
    result.pushKV("weight", (int)::GetBlockWeight(block));
    UniValue txs(UniValue::VARR);

    switch (verbosity) {
        case TxVerbosity::SHOW_TXID:
            for (const CTransactionRef& tx : block.vtx) {
                txs.push_back(tx->GetHash().GetHex());
            }
            break;

        case TxVerbosity::SHOW_DETAILS:
        case TxVerbosity::SHOW_DETAILS_AND_PREVOUT:
            CBlockUndo blockUndo;
            const bool is_not_pruned{WITH_LOCK(::cs_main, return !blockman.IsBlockPruned(blockindex))};
            bool have_undo{is_not_pruned && WITH_LOCK(::cs_main, return blockindex.nStatus & BLOCK_HAVE_UNDO)};
            if (have_undo && !blockman.UndoReadFromDisk(blockUndo, blockindex)) {
                throw JSONRPCError(RPC_INTERNAL_ERROR, "Undo data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
            }
            for (size_t i = 0; i < block.vtx.size(); ++i) {
                const CTransactionRef& tx = block.vtx.at(i);
                // coinbase transaction (i.e. i == 0) doesn't have undo data
                const CTxUndo* txundo = (have_undo && i > 0) ? &blockUndo.vtxundo.at(i - 1) : nullptr;
                UniValue objTx(UniValue::VOBJ);
                TxToUniv(*tx, /*block_hash=*/uint256(), /*entry=*/objTx, /*include_hex=*/true, txundo, verbosity);
                txs.push_back(std::move(objTx));
            }
            break;
    }

    result.pushKV("tx", std::move(txs));

    return result;
}